

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_create.cpp
# Opt level: O2

BoundStatement * __thiscall
duckdb::Binder::Bind(BoundStatement *__return_storage_ptr__,Binder *this,CreateStatement *stmt)

{
  unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *this_00;
  char cVar1;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var2;
  ClientContext *pCVar3;
  TableCatalogEntry *pTVar4;
  long *plVar5;
  pointer pVVar6;
  CatalogTransaction transaction_00;
  optional_ptr<duckdb::ExpressionBinder,_true> oVar7;
  __buckets_ptr pp_Var8;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> uVar9;
  _func_int **pp_Var10;
  bool bVar11;
  int iVar12;
  pointer pCVar13;
  StatementProperties *this_01;
  pointer pBVar14;
  pointer pLVar15;
  Catalog *pCVar16;
  pointer pEVar17;
  type pEVar18;
  CreateViewInfo *base;
  pointer pBVar19;
  BoundBaseTableRef *pBVar20;
  SchemaCatalogEntry *pSVar21;
  type statement;
  reference pvVar22;
  pointer pLVar23;
  reference args_1;
  pointer this_02;
  type pCVar24;
  SecretManager *this_03;
  string *name_p;
  string *catalog;
  CatalogEntry *pCVar25;
  vector<duckdb::Value,_true> *pvVar26;
  InvalidInputException *pIVar27;
  InternalException *this_04;
  BinderException *pBVar28;
  Value *item;
  size_type *this_05;
  pointer pVVar29;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *other;
  pointer pBVar30;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<duckdb::LogicalType> __l_00;
  undefined1 local_360 [8];
  Value local_358;
  optional_ptr<duckdb::ExpressionBinder,_true> local_318;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_310;
  case_insensitive_map_t<Value> bound_options;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_2d0;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_2c8;
  CreateInfo *local_2c0;
  DatabaseInstance *local_2b8;
  unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
  bound_info;
  undefined1 local_2a8 [24];
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_230 [24];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_218;
  OnCreateConflict local_1e0;
  SecretPersistType local_1df;
  BoundStatement result;
  CatalogTransaction transaction;
  ConstantBinder default_binder;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  scope_strings;
  string provider_string;
  string type_string;
  string local_90;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  result.names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  result.names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  result.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  result.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  result.plan.
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
       (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
        )0x0;
  result.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  result.names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::__cxx11::string::string((string *)&bound_info,"Count",(allocator *)&local_358);
  __l._M_len = 1;
  __l._M_array = (iterator)&bound_info;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&default_binder,__l,(allocator_type *)&bound_options);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&result.names,&default_binder);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&default_binder);
  ::std::__cxx11::string::~string((string *)&bound_info);
  LogicalType::LogicalType((LogicalType *)&default_binder,BIGINT);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&default_binder;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&bound_info,__l_00
             ,(allocator_type *)&local_358);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
            (&result.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&bound_info);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&bound_info);
  LogicalType::~LogicalType((LogicalType *)&default_binder);
  this_00 = &stmt->info;
  pCVar13 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
            operator->(this_00);
  cVar1 = (pCVar13->super_ParseInfo).field_0x9;
  this_01 = GetStatementProperties(this);
  switch(cVar1) {
  case '\x01':
    local_2c0 = (this_00->
                super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)._M_t
                .super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>
                .super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
    (this_00->super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)._M_t.
    super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
    super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl = (CreateInfo *)0x0;
    BindCreateTableInfo((Binder *)&bound_info,
                        (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                         *)this);
    if (local_2c0 != (CreateInfo *)0x0) {
      (**(code **)((long)(local_2c0->super_ParseInfo)._vptr_ParseInfo + 8))();
    }
    local_2c0 = (CreateInfo *)0x0;
    pBVar14 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
              ::operator->(&bound_info);
    _Var2._M_head_impl =
         (pBVar14->query).
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (pBVar14->query).
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    default_binder.super_ExpressionBinder._vptr_ExpressionBinder = (_func_int **)_Var2._M_head_impl;
    pBVar14 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
              ::operator->(&bound_info);
    make_uniq<duckdb::LogicalCreateTable,duckdb::SchemaCatalogEntry&,duckdb::unique_ptr<duckdb::BoundCreateTableInfo,std::default_delete<duckdb::BoundCreateTableInfo>,true>>
              ((duckdb *)&local_358,pBVar14->schema,&bound_info);
    if (_Var2._M_head_impl != (LogicalOperator *)0x0) {
      this_01->return_type = CHANGED_ROWS;
      pLVar15 = unique_ptr<duckdb::LogicalCreateTable,_std::default_delete<duckdb::LogicalCreateTable>,_true>
                ::operator->((unique_ptr<duckdb::LogicalCreateTable,_std::default_delete<duckdb::LogicalCreateTable>,_true>
                              *)&local_358);
      ::std::
      vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                  *)&(pLVar15->super_LogicalOperator).children,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&default_binder);
    }
    uVar9.super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         result.plan.
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    result.plan.
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         local_358.type_._0_8_;
    local_358.type_._0_8_ = (_Head_base<0UL,_duckdb::LogicalCreateTable_*,_false>)0x0;
    if ((uVar9.
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
         (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
          )0x0) &&
       ((**(code **)(*(long *)uVar9.
                              super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                              .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl
                    + 8))(),
       (_Tuple_impl<0UL,_duckdb::LogicalCreateTable_*,_std::default_delete<duckdb::LogicalCreateTable>_>
        )local_358.type_._0_8_ != (LogicalCreateTable *)0x0)) {
      (*(code *)(*(__node_base_ptr *)local_358.type_._0_8_)[1]._M_nxt)();
    }
    if (default_binder.super_ExpressionBinder._vptr_ExpressionBinder != (_func_int **)0x0) {
      (**(code **)(*default_binder.super_ExpressionBinder._vptr_ExpressionBinder + 8))();
    }
    ::std::
    unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>::
    ~unique_ptr(&bound_info.
                 super_unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
               );
    break;
  case '\x02':
    pCVar13 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
              operator->(this_00);
    BindCatalog((string *)&bound_info,this,&pCVar13->catalog);
    pCVar16 = Catalog::GetCatalog(this->context,(string *)&bound_info);
    StatementProperties::RegisterDBModify(this_01,pCVar16,this->context);
    local_358.type_.id_ = 0x82;
    make_uniq<duckdb::LogicalCreate,duckdb::LogicalOperatorType,duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>>
              ((duckdb *)&default_binder,(LogicalOperatorType *)&local_358,this_00);
    pp_Var10 = default_binder.super_ExpressionBinder._vptr_ExpressionBinder;
    uVar9 = result.plan;
    default_binder.super_ExpressionBinder._vptr_ExpressionBinder = (_func_int **)0x0;
    result.plan.
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         pp_Var10;
    if ((uVar9.
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
         (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
          )0x0) &&
       ((**(code **)(*(long *)uVar9.
                              super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                              .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl
                    + 8))(),
       default_binder.super_ExpressionBinder._vptr_ExpressionBinder != (_func_int **)0x0)) {
      (**(code **)(*default_binder.super_ExpressionBinder._vptr_ExpressionBinder + 8))();
    }
    ::std::__cxx11::string::~string((string *)&bound_info);
    break;
  case '\x03':
    base = (CreateViewInfo *)
           unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     (this_00);
    pCVar24 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
              operator*(this_00);
    pSVar21 = BindCreateSchema(this,pCVar24);
    BindCreateViewInfo(this,base);
    local_358.type_.id_ = 0x81;
    default_binder.super_ExpressionBinder._vptr_ExpressionBinder = (_func_int **)pSVar21;
    make_uniq<duckdb::LogicalCreate,duckdb::LogicalOperatorType,duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>,duckdb::SchemaCatalogEntry*>
              ((duckdb *)&bound_info,(LogicalOperatorType *)&local_358,this_00,
               (SchemaCatalogEntry **)&default_binder);
    goto LAB_012b43ae;
  case '\x04':
    pCVar13 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
              operator->(this_00);
    TableDescription::TableDescription
              ((TableDescription *)&bound_info,&pCVar13->catalog,&pCVar13->schema,
               (string *)(pCVar13 + 1));
    make_uniq<duckdb::BaseTableRef,duckdb::TableDescription&>
              ((duckdb *)&local_358,(TableDescription *)&bound_info);
    unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::operator*
              ((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true> *)
               &local_358);
    Bind((Binder *)&bound_options,(BaseTableRef *)this);
    pBVar19 = unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::
              operator->((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                          *)&bound_options);
    if (pBVar19->type != BASE_TABLE) {
      pBVar28 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&default_binder,"can only create an index on a base table",
                 (allocator *)&transaction);
      BinderException::BinderException(pBVar28,(string *)&default_binder);
      __cxa_throw(pBVar28,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pBVar19 = unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::
              operator->((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                          *)&bound_options);
    pBVar20 = BoundTableRef::Cast<duckdb::BoundBaseTableRef>(pBVar19);
    pTVar4 = pBVar20->table;
    if ((pTVar4->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.temporary == true) {
      pCVar13 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
                operator->(this_00);
      pCVar13->temporary = true;
    }
    StatementProperties::RegisterDBModify
              (this_01,(pTVar4->super_StandardEntry).super_InCatalogEntry.catalog,this->context);
    unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::operator*
              ((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                *)&bound_options);
    CreatePlan((Binder *)&transaction,(BoundTableRef *)this);
    pLVar23 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                            *)&transaction);
    if (pLVar23->type != LOGICAL_GET) {
      pBVar28 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&default_binder,"Cannot create index on a view!",
                 (allocator *)&provider_string);
      BinderException::BinderException(pBVar28,(string *)&default_binder);
      __cxa_throw(pBVar28,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pCVar16 = (pTVar4->super_StandardEntry).super_InCatalogEntry.catalog;
    local_2b8 = transaction.db.ptr;
    transaction.db.ptr = (DatabaseInstance *)0x0;
    (*pCVar16->_vptr_Catalog[0x11])(&default_binder,pCVar16,this,stmt,pTVar4);
    pp_Var10 = default_binder.super_ExpressionBinder._vptr_ExpressionBinder;
    uVar9 = result.plan;
    default_binder.super_ExpressionBinder._vptr_ExpressionBinder = (_func_int **)0x0;
    result.plan.
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         pp_Var10;
    if ((uVar9.
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
         (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
          )0x0) &&
       ((**(code **)(*(long *)uVar9.
                              super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                              .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl
                    + 8))(),
       default_binder.super_ExpressionBinder._vptr_ExpressionBinder != (_func_int **)0x0)) {
      (**(code **)(*default_binder.super_ExpressionBinder._vptr_ExpressionBinder + 8))();
    }
    default_binder.super_ExpressionBinder._vptr_ExpressionBinder = (_func_int **)0x0;
    if (local_2b8 != (DatabaseInstance *)0x0) {
      (*(code *)(((local_2b8->super_enable_shared_from_this<duckdb::DatabaseInstance>).__weak_this_.
                  internal.super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->super_enable_shared_from_this<duckdb::DatabaseInstance>).__weak_this_.
                internal.super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)();
    }
    local_2b8 = (DatabaseInstance *)0x0;
    if (transaction.db.ptr != (DatabaseInstance *)0x0) {
      (*(code *)((((transaction.db.ptr)->super_enable_shared_from_this<duckdb::DatabaseInstance>).
                  __weak_this_.internal.
                  super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::DatabaseInstance>).__weak_this_.internal.
                super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)();
    }
    if (bound_options._M_h._M_buckets != (__buckets_ptr)0x0) {
      (*(code *)(*bound_options._M_h._M_buckets)[1]._M_nxt)();
    }
    if ((LogicalCreateTable *)local_358.type_._0_8_ != (LogicalCreateTable *)0x0) {
      (*(code *)((__node_base_ptr)((LogicalOperator *)local_358.type_._0_8_)->_vptr_LogicalOperator)
                [1]._M_nxt)();
    }
    TableDescription::~TableDescription((TableDescription *)&bound_info);
    break;
  case '\x05':
  case '\a':
switchD_012b3723_caseD_5:
    this_04 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&bound_info,"Unrecognized type!",(allocator *)&default_binder);
    InternalException::InternalException(this_04,(string *)&bound_info);
    __cxa_throw(this_04,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case '\x06':
    pCVar24 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
              operator*(this_00);
    default_binder.super_ExpressionBinder._vptr_ExpressionBinder =
         (_func_int **)BindCreateSchema(this,pCVar24);
    local_358.type_.id_ = 0x80;
    make_uniq<duckdb::LogicalCreate,duckdb::LogicalOperatorType,duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>,duckdb::SchemaCatalogEntry*>
              ((duckdb *)&bound_info,(LogicalOperatorType *)&local_358,this_00,
               (SchemaCatalogEntry **)&default_binder);
    goto LAB_012b43ae;
  case '\b':
    pCVar24 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
              operator*(this_00);
    pSVar21 = BindCreateSchema(this,pCVar24);
    pCVar13 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
              operator->(this_00);
    local_358.type_.id_ = 0x87;
    default_binder.super_ExpressionBinder._vptr_ExpressionBinder = (_func_int **)pSVar21;
    make_uniq<duckdb::LogicalCreate,duckdb::LogicalOperatorType,duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>,duckdb::SchemaCatalogEntry*>
              ((duckdb *)&bound_info,(LogicalOperatorType *)&local_358,this_00,
               (SchemaCatalogEntry **)&default_binder);
    uVar9 = result.plan;
    result.plan.
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         bound_info;
    bound_info.
    super_unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
    .super__Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>._M_head_impl =
         (unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
          )(__uniq_ptr_data<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true,_true>
            )0x0;
    if ((uVar9.
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
         (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
          )0x0) &&
       ((**(code **)(*(long *)uVar9.
                              super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                              .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl
                    + 8))(),
       bound_info.
       super_unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
       .super__Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>._M_head_impl !=
       (__uniq_ptr_data<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true,_true>
        )0x0)) {
      (**(code **)(*(long *)bound_info.
                            super_unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
                            .super__Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>.
                            _M_head_impl + 8))();
    }
    pCVar16 = Catalog::GetCatalog(this->context,&pCVar13->catalog);
    if (pCVar13[1].schema._M_string_length == 0) {
      other = &pCVar13[1].catalog.field_2;
      if (pCVar13[1].catalog.field_2._M_local_buf[0] == '\x04') {
        local_38 = ::std::
                   _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/statement/bind_create.cpp:491:30)>
                   ::_M_invoke;
        local_40 = ::std::
                   _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/statement/bind_create.cpp:491:30)>
                   ::_M_manager;
        local_50._M_unused._M_object = &pCVar13->dependencies;
        local_50._8_8_ = pCVar16;
        SetCatalogLookupCallback(this,(catalog_entry_callback_t *)&local_50);
        ::std::_Function_base::~_Function_base((_Function_base *)&local_50);
        name_p = UserType::GetTypeName_abi_cxx11_((LogicalType *)other);
        EntryLookupInfo::EntryLookupInfo
                  ((EntryLookupInfo *)&bound_info,TYPE_ENTRY,(string *)name_p,
                   (QueryErrorContext)0xffffffffffffffff);
        catalog = Catalog::GetName_abi_cxx11_((pSVar21->super_InCatalogEntry).catalog);
        default_binder.super_ExpressionBinder._vptr_ExpressionBinder =
             (_func_int **)
             CatalogEntryRetriever::GetEntry
                       (&this->entry_retriever,catalog,
                        &(pSVar21->super_InCatalogEntry).super_CatalogEntry.name,
                        (EntryLookupInfo *)&bound_info,THROW_EXCEPTION);
        pCVar25 = optional_ptr<duckdb::CatalogEntry,_true>::operator->
                            ((optional_ptr<duckdb::CatalogEntry,_true> *)&default_binder);
        LogicalType::operator=((LogicalType *)other,(LogicalType *)&pCVar25[1].timestamp);
      }
      else {
        local_58 = ::std::
                   _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/statement/bind_create.cpp:491:30)>
                   ::_M_invoke;
        local_60 = ::std::
                   _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/statement/bind_create.cpp:491:30)>
                   ::_M_manager;
        local_70._M_unused._M_object = &pCVar13->dependencies;
        local_70._8_8_ = pCVar16;
        SetCatalogLookupCallback(this,(catalog_entry_callback_t *)&local_70);
        ::std::_Function_base::~_Function_base((_Function_base *)&local_70);
        LogicalType::LogicalType((LogicalType *)&default_binder,(LogicalType *)other);
        ::std::__cxx11::string::string
                  ((string *)&bound_info,anon_var_dwarf_3b2a81b + 9,(allocator *)&local_358);
        BindLogicalType(this,(LogicalType *)other,(optional_ptr<duckdb::Catalog,_true>)0x0,
                        (string *)&bound_info);
        ::std::__cxx11::string::~string((string *)&bound_info);
        LogicalType::operator=((LogicalType *)other,(LogicalType *)&default_binder);
        LogicalType::~LogicalType((LogicalType *)&default_binder);
      }
    }
    else {
      this_05 = &pCVar13[1].schema._M_string_length;
      statement = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                  ::operator*((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                               *)this_05);
      Bind((BoundStatement *)&bound_info,this,statement);
      bound_options._M_h._M_buckets =
           (__buckets_ptr)
           bound_info.
           super_unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
           .super__Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>._M_head_impl;
      bound_info.
      super_unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
      .super__Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>._M_head_impl =
           (unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
            )(__uniq_ptr_data<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true,_true>
              )0x0;
      plVar5 = (long *)*this_05;
      *this_05 = 0;
      if (plVar5 != (long *)0x0) {
        (**(code **)(*plVar5 + 8))();
      }
      if (local_2a8._8_8_ - local_2a8._0_8_ != 0x18) {
        pBVar28 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&default_binder,"The query must return a single column",
                   (allocator *)&local_358);
        BinderException::BinderException(pBVar28,(string *)&default_binder);
        __cxa_throw(pBVar28,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pvVar22 = vector<duckdb::LogicalType,_true>::get<true>
                          ((vector<duckdb::LogicalType,_true> *)local_2a8,0);
      if (pvVar22->id_ != VARCHAR) {
        default_binder.super_ExpressionBinder._vptr_ExpressionBinder = (_func_int **)0x0;
        default_binder.super_ExpressionBinder.target_type.id_ = INVALID;
        default_binder.super_ExpressionBinder.target_type.physical_type_ = ~INVALID;
        default_binder.super_ExpressionBinder.target_type._2_6_ = 0;
        default_binder.super_ExpressionBinder.target_type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        pvVar22 = vector<duckdb::LogicalType,_true>::get<true>
                            ((vector<duckdb::LogicalType,_true> *)local_2a8,0);
        pLVar23 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                                *)&bound_options);
        (*pLVar23->_vptr_LogicalOperator[2])(&local_358);
        args_1 = vector<duckdb::ColumnBinding,_true>::get<true>
                           ((vector<duckdb::ColumnBinding,_true> *)&local_358,0);
        make_uniq<duckdb::BoundColumnRefExpression,duckdb::LogicalType&,duckdb::ColumnBinding&>
                  ((duckdb *)&transaction,pvVar22,args_1);
        ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::
        ~_Vector_base((_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *
                      )&local_358);
        local_310._M_head_impl = (Expression *)transaction.db;
        pCVar3 = this->context;
        transaction.db.ptr = (DatabaseInstance *)0x0;
        LogicalType::LogicalType(&local_358.type_,VARCHAR);
        BoundCastExpression::AddCastToType
                  ((BoundCastExpression *)&provider_string,pCVar3,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_310,&local_358.type_,false);
        LogicalType::~LogicalType(&local_358.type_);
        if ((DatabaseInstance *)local_310._M_head_impl != (DatabaseInstance *)0x0) {
          (*(code *)(((((weak_ptr<duckdb::DatabaseInstance,_true> *)
                       &((local_310._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
                      internal).
                      super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->super_enable_shared_from_this<duckdb::DatabaseInstance>).__weak_this_.internal
                    .super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)();
        }
        local_310._M_head_impl = (Expression *)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&default_binder,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &provider_string);
        type_string._M_dataplus._M_p = (pointer)GenerateTableIndex(this);
        make_uniq<duckdb::LogicalProjection,unsigned_long,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
                  ((duckdb *)&local_358,(unsigned_long *)&type_string,
                   (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)&default_binder);
        this_02 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                                *)&local_358);
        local_2c8._M_head_impl = (LogicalOperator *)bound_options._M_h._M_buckets;
        bound_options._M_h._M_buckets = (__buckets_ptr)0x0;
        LogicalOperator::AddChild
                  (&this_02->super_LogicalOperator,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)&local_2c8);
        if (local_2c8._M_head_impl != (LogicalOperator *)0x0) {
          (*(code *)((__node_base_ptr)(local_2c8._M_head_impl)->_vptr_LogicalOperator)[1]._M_nxt)();
        }
        pp_Var8 = bound_options._M_h._M_buckets;
        bound_options._M_h._M_buckets = (__buckets_ptr)local_358.type_._0_8_;
        local_2c8._M_head_impl = (LogicalOperator *)0x0;
        local_358.type_._0_8_ = (_Head_base<0UL,_duckdb::LogicalCreateTable_*,_false>)0x0;
        if ((pp_Var8 != (__buckets_ptr)0x0) &&
           ((*(code *)(*pp_Var8)[1]._M_nxt)(),
           (LogicalCreateTable *)local_358.type_._0_8_ != (LogicalCreateTable *)0x0)) {
          (*(code *)((__node_base_ptr)
                    ((LogicalOperator *)local_358.type_._0_8_)->_vptr_LogicalOperator)[1]._M_nxt)();
        }
        if (provider_string._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)provider_string._M_dataplus._M_p + 8))();
        }
        if (transaction.db.ptr != (DatabaseInstance *)0x0) {
          (*(code *)((((transaction.db.ptr)->super_enable_shared_from_this<duckdb::DatabaseInstance>
                      ).__weak_this_.internal.
                      super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->super_enable_shared_from_this<duckdb::DatabaseInstance>).__weak_this_.internal
                    .super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)();
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   *)&default_binder);
      }
      pLVar23 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->(&result.plan);
      local_2d0._M_head_impl = (LogicalOperator *)bound_options._M_h._M_buckets;
      bound_options._M_h._M_buckets = (__buckets_ptr)0x0;
      LogicalOperator::AddChild
                (pLVar23,(unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                          *)&local_2d0);
      if (local_2d0._M_head_impl != (LogicalOperator *)0x0) {
        (*(code *)((__node_base_ptr)(local_2d0._M_head_impl)->_vptr_LogicalOperator)[1]._M_nxt)();
      }
      local_2d0._M_head_impl = (LogicalOperator *)0x0;
      if (bound_options._M_h._M_buckets != (__buckets_ptr)0x0) {
        (*(code *)(*bound_options._M_h._M_buckets)[1]._M_nxt)();
      }
      BoundStatement::~BoundStatement((BoundStatement *)&bound_info);
    }
    break;
  default:
    if (cVar1 == '\x1e') {
      pCVar24 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
                operator*(this_00);
      default_binder.super_ExpressionBinder._vptr_ExpressionBinder =
           (_func_int **)BindCreateFunctionInfo(this,pCVar24);
      local_358.type_.id_ = 0x83;
      make_uniq<duckdb::LogicalCreate,duckdb::LogicalOperatorType,duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>,duckdb::SchemaCatalogEntry*>
                ((duckdb *)&bound_info,(LogicalOperatorType *)&local_358,this_00,
                 (SchemaCatalogEntry **)&default_binder);
    }
    else {
      if (cVar1 != '\x1f') {
        if (cVar1 != 'G') goto switchD_012b3723_caseD_5;
        pCVar16 = Catalog::GetSystemCatalog(this->context);
        CatalogTransaction::CatalogTransaction(&transaction,pCVar16,this->context);
        this_01->return_type = QUERY_RESULT;
        local_318.ptr =
             (ExpressionBinder *)
             unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
             operator->(this_00);
        pCVar3 = this->context;
        ::std::__cxx11::string::string
                  ((string *)&local_90,"Secret Parameter",(allocator *)&bound_info);
        ConstantBinder::ConstantBinder(&default_binder,this,pCVar3,&local_90);
        ::std::__cxx11::string::~string((string *)&local_90);
        provider_string._M_dataplus._M_p = (pointer)&provider_string.field_2;
        provider_string._M_string_length = 0;
        provider_string.field_2._M_local_buf[0] = '\0';
        type_string._M_dataplus._M_p = (pointer)&type_string.field_2;
        type_string._M_string_length = 0;
        type_string.field_2._M_local_buf[0] = '\0';
        scope_strings.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        scope_strings.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        scope_strings.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        if ((((string *)&local_318.ptr[3].macro_binding)->_M_dataplus)._M_p != (pointer)0x0) {
          ExpressionBinder::Bind
                    ((ExpressionBinder *)local_360,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&default_binder,(LogicalType *)&local_318.ptr[3].macro_binding,false);
          pEVar17 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                *)local_360);
          iVar12 = (*(pEVar17->super_BaseExpression)._vptr_BaseExpression[6])(pEVar17);
          if ((char)iVar12 != '\0') {
            pIVar27 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&bound_info,"Create Secret expressions can not have parameters!",
                       (allocator *)&local_358);
            InvalidInputException::InvalidInputException(pIVar27,(string *)&bound_info);
            __cxa_throw(pIVar27,&InvalidInputException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          pCVar3 = this->context;
          pEVar18 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                               *)local_360);
          ExpressionExecutor::EvaluateScalar((Value *)&bound_info,pCVar3,pEVar18,true);
          Value::ToString_abi_cxx11_((string *)&bound_options,(Value *)&bound_info);
          StringUtil::Lower((string *)&local_358,(string *)&bound_options);
          ::std::__cxx11::string::operator=((string *)&provider_string,(string *)&local_358);
          ::std::__cxx11::string::~string((string *)&local_358);
          ::std::__cxx11::string::~string((string *)&bound_options);
          Value::~Value((Value *)&bound_info);
          if (local_360 != (undefined1  [8])0x0) {
            (*((BaseExpression *)local_360)->_vptr_BaseExpression[1])();
          }
        }
        if (local_318.ptr[2].bound_columns.
            super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
            .
            super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          ExpressionBinder::Bind
                    ((ExpressionBinder *)local_360,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&default_binder,
                     (optional_ptr<duckdb::LogicalType,_true>)
                     &local_318.ptr[2].bound_columns.
                      super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                      .
                      super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
          pEVar17 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                *)local_360);
          iVar12 = (*(pEVar17->super_BaseExpression)._vptr_BaseExpression[6])(pEVar17);
          if ((char)iVar12 != '\0') {
            pIVar27 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&bound_info,"Create Secret expressions can not have parameters!",
                       (allocator *)&local_358);
            InvalidInputException::InvalidInputException(pIVar27,(string *)&bound_info);
            __cxa_throw(pIVar27,&InvalidInputException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          pCVar3 = this->context;
          pEVar18 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                               *)local_360);
          ExpressionExecutor::EvaluateScalar((Value *)&bound_info,pCVar3,pEVar18,true);
          Value::ToString_abi_cxx11_((string *)&bound_options,(Value *)&bound_info);
          StringUtil::Lower((string *)&local_358,(string *)&bound_options);
          ::std::__cxx11::string::operator=((string *)&type_string,(string *)&local_358);
          ::std::__cxx11::string::~string((string *)&local_358);
          ::std::__cxx11::string::~string((string *)&bound_options);
          Value::~Value((Value *)&bound_info);
          if ((_Head_base<0UL,_duckdb::Expression_*,_false>)local_360 !=
              (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
            (*((BaseExpression *)local_360)->_vptr_BaseExpression[1])();
          }
        }
        if ((((string *)&local_318.ptr[3].stored_binder)->_M_dataplus)._M_p != (pointer)0x0) {
          ExpressionBinder::Bind
                    ((ExpressionBinder *)local_360,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&default_binder,(LogicalType *)&local_318.ptr[3].stored_binder,false);
          pEVar17 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                *)local_360);
          iVar12 = (*(pEVar17->super_BaseExpression)._vptr_BaseExpression[6])(pEVar17);
          if ((char)iVar12 != '\0') {
            pIVar27 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&bound_info,"Create Secret expressions can not have parameters!",
                       (allocator *)&local_358);
            InvalidInputException::InvalidInputException(pIVar27,(string *)&bound_info);
            __cxa_throw(pIVar27,&InvalidInputException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          pCVar3 = this->context;
          pEVar18 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                               *)local_360);
          ExpressionExecutor::EvaluateScalar((Value *)&bound_info,pCVar3,pEVar18,true);
          LogicalType::LogicalType(&local_358.type_,VARCHAR);
          bVar11 = LogicalType::operator==((LogicalType *)&bound_info,&local_358.type_);
          LogicalType::~LogicalType(&local_358.type_);
          if (bVar11) {
            Value::ToString_abi_cxx11_((string *)&local_358,(Value *)&bound_info);
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &scope_strings,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_358);
            ::std::__cxx11::string::~string((string *)&local_358);
          }
          else {
            LogicalType::LogicalType((LogicalType *)&bound_options,VARCHAR);
            LogicalType::LIST(&local_358.type_,(LogicalType *)&bound_options);
            bVar11 = LogicalType::operator==((LogicalType *)&bound_info,&local_358.type_);
            LogicalType::~LogicalType(&local_358.type_);
            LogicalType::~LogicalType((LogicalType *)&bound_options);
            if (bVar11) {
              pvVar26 = ListValue::GetChildren((Value *)&bound_info);
              pVVar6 = (pvVar26->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                       super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              for (pVVar29 = (pvVar26->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                             _M_impl.super__Vector_impl_data._M_start; pVVar29 != pVVar6;
                  pVVar29 = pVVar29 + 1) {
                Value::GetValue<std::__cxx11::string>((string *)&local_358,pVVar29);
                ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &scope_strings,(string *)&local_358);
                ::std::__cxx11::string::~string((string *)&local_358);
              }
            }
            else {
              if (bound_info.
                  super_unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
                  ._M_t.
                  super___uniq_ptr_impl<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
                  .super__Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>._M_head_impl._1_1_
                  != '\x18') {
                pIVar27 = (InvalidInputException *)__cxa_allocate_exception(0x10);
                ::std::__cxx11::string::string
                          ((string *)&local_358,
                           "Create Secret scope must be of type VARCHAR or LIST(VARCHAR)",
                           (allocator *)&bound_options);
                InvalidInputException::InvalidInputException(pIVar27,(string *)&local_358);
                __cxa_throw(pIVar27,&InvalidInputException::typeinfo,
                            ::std::runtime_error::~runtime_error);
              }
              pvVar26 = StructValue::GetChildren((Value *)&bound_info);
              pVVar6 = (pvVar26->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                       super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              for (pVVar29 = (pvVar26->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                             _M_impl.super__Vector_impl_data._M_start; pVVar29 != pVVar6;
                  pVVar29 = pVVar29 + 1) {
                LogicalType::LogicalType((LogicalType *)&local_358,VARCHAR);
                bVar11 = LogicalType::operator!=(&pVVar29->type_,(LogicalType *)&local_358);
                LogicalType::~LogicalType((LogicalType *)&local_358);
                if (bVar11) {
                  pIVar27 = (InvalidInputException *)__cxa_allocate_exception(0x10);
                  ::std::__cxx11::string::string
                            ((string *)&local_358,
                             "Invalid input to scope parameter of create secret: only struct of VARCHARs is allowed"
                             ,(allocator *)&bound_options);
                  InvalidInputException::InvalidInputException(pIVar27,(string *)&local_358);
                  __cxa_throw(pIVar27,&InvalidInputException::typeinfo,
                              ::std::runtime_error::~runtime_error);
                }
                Value::GetValue<std::__cxx11::string>((string *)&local_358,pVVar29);
                ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &scope_strings,(string *)&local_358);
                ::std::__cxx11::string::~string((string *)&local_358);
              }
            }
          }
          Value::~Value((Value *)&bound_info);
          if (local_360 != (undefined1  [8])0x0) {
            (**(code **)(*(_func_int **)local_360 + 8))();
          }
        }
        bound_options._M_h._M_buckets = &bound_options._M_h._M_single_bucket;
        bound_options._M_h._M_bucket_count = 1;
        bound_options._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        bound_options._M_h._M_element_count = 0;
        bound_options._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        bound_options._M_h._M_rehash_policy._M_next_resize = 0;
        bound_options._M_h._M_single_bucket = (__node_base_ptr)0x0;
        pBVar30 = (pointer)&local_318.ptr[3].bound_columns.
                            super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                            .
                            super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
        while (pBVar30 = *(pointer *)&pBVar30->name, pBVar30 != (pointer)0x0) {
          ExpressionBinder::Bind
                    ((ExpressionBinder *)local_360,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&default_binder,(LogicalType *)(pBVar30 + 1),false);
          pEVar17 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                *)local_360);
          iVar12 = (*(pEVar17->super_BaseExpression)._vptr_BaseExpression[6])(pEVar17);
          if ((char)iVar12 != '\0') {
            pIVar27 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&bound_info,"Create Secret expressions can not have parameters!",
                       (allocator *)&local_358);
            InvalidInputException::InvalidInputException(pIVar27,(string *)&bound_info);
            __cxa_throw(pIVar27,&InvalidInputException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          pCVar3 = this->context;
          pEVar18 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                               *)local_360);
          ExpressionExecutor::EvaluateScalar(&local_358,pCVar3,pEVar18,true);
          ::std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
          ::pair<duckdb::Value,_true>
                    ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
                      *)&bound_info,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &(pBVar30->name)._M_string_length,&local_358);
          ::std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<std::__cxx11::string_const,duckdb::Value>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&bound_options,
                     (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
                      *)&bound_info);
          ::std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
          ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
                   *)&bound_info);
          Value::~Value(&local_358);
          if (local_360 != (undefined1  [8])0x0) {
            (*((BaseExpression *)local_360)->_vptr_BaseExpression[1])();
          }
        }
        ::std::__cxx11::string::string((string *)&bound_info,(string *)&type_string);
        ::std::__cxx11::string::string(local_290,(string *)&provider_string);
        oVar7.ptr = local_318.ptr;
        ::std::__cxx11::string::string(local_270,(string *)(local_318.ptr + 3));
        ::std::__cxx11::string::string(local_250,(string *)&oVar7.ptr[3].lambda_bindings);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(local_230,
                 &scope_strings.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                );
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::_Hashtable(&local_218,&bound_options._M_h);
        local_1e0 = *(OnCreateConflict *)
                     &local_318.ptr[2].bound_columns.
                      super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                      .
                      super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
        local_1df = *(SecretPersistType *)
                     ((long)&local_318.ptr[2].bound_columns.
                             super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                             .
                             super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 1);
        this_03 = SecretManager::Get(this->context);
        transaction_00.context.ptr = transaction.context.ptr;
        transaction_00.db.ptr = transaction.db.ptr;
        transaction_00.transaction.ptr = transaction.transaction.ptr;
        transaction_00.transaction_id = transaction.transaction_id;
        transaction_00.start_time = transaction.start_time;
        SecretManager::BindCreateSecret
                  (__return_storage_ptr__,this_03,transaction_00,(CreateSecretInput *)&bound_info);
        CreateSecretInput::~CreateSecretInput((CreateSecretInput *)&bound_info);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&bound_options._M_h);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&scope_strings);
        ::std::__cxx11::string::~string((string *)&type_string);
        ::std::__cxx11::string::~string((string *)&provider_string);
        ConstantBinder::~ConstantBinder(&default_binder);
        goto LAB_012b440f;
      }
      pCVar24 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
                operator*(this_00);
      default_binder.super_ExpressionBinder._vptr_ExpressionBinder =
           (_func_int **)BindCreateSchema(this,pCVar24);
      local_358.type_.id_ = 0x83;
      make_uniq<duckdb::LogicalCreate,duckdb::LogicalOperatorType,duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>,duckdb::SchemaCatalogEntry*>
                ((duckdb *)&bound_info,(LogicalOperatorType *)&local_358,this_00,
                 (SchemaCatalogEntry **)&default_binder);
    }
LAB_012b43ae:
    uVar9.super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         result.plan.
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    result.plan.
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         bound_info.
         super_unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
         .super__Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>._M_head_impl;
    bound_info.
    super_unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
    .super__Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>._M_head_impl =
         (unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
          )(__uniq_ptr_data<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true,_true>
            )0x0;
    if ((uVar9.
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
         (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
          )0x0) &&
       ((**(code **)(*(long *)uVar9.
                              super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                              .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl
                    + 8))(),
       bound_info.
       super_unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
       .super__Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>._M_head_impl !=
       (__uniq_ptr_data<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true,_true>
        )0x0)) {
      (**(code **)(*(long *)bound_info.
                            super_unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
                            .super__Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>.
                            _M_head_impl + 8))();
    }
  }
  this_01->return_type = NOTHING;
  this_01->allow_stream_result = false;
  BoundStatement::BoundStatement(__return_storage_ptr__,&result);
LAB_012b440f:
  BoundStatement::~BoundStatement(&result);
  return __return_storage_ptr__;
}

Assistant:

BoundStatement Binder::Bind(CreateStatement &stmt) {
	BoundStatement result;
	result.names = {"Count"};
	result.types = {LogicalType::BIGINT};

	auto catalog_type = stmt.info->type;
	auto &properties = GetStatementProperties();
	switch (catalog_type) {
	case CatalogType::SCHEMA_ENTRY: {
		auto &base = stmt.info->Cast<CreateInfo>();
		auto catalog = BindCatalog(base.catalog);
		properties.RegisterDBModify(Catalog::GetCatalog(context, catalog), context);
		result.plan = make_uniq<LogicalCreate>(LogicalOperatorType::LOGICAL_CREATE_SCHEMA, std::move(stmt.info));
		break;
	}
	case CatalogType::VIEW_ENTRY: {
		auto &base = stmt.info->Cast<CreateViewInfo>();
		// bind the schema
		auto &schema = BindCreateSchema(*stmt.info);
		BindCreateViewInfo(base);
		result.plan = make_uniq<LogicalCreate>(LogicalOperatorType::LOGICAL_CREATE_VIEW, std::move(stmt.info), &schema);
		break;
	}
	case CatalogType::SEQUENCE_ENTRY: {
		auto &schema = BindCreateSchema(*stmt.info);
		result.plan =
		    make_uniq<LogicalCreate>(LogicalOperatorType::LOGICAL_CREATE_SEQUENCE, std::move(stmt.info), &schema);
		break;
	}
	case CatalogType::TABLE_MACRO_ENTRY: {
		auto &schema = BindCreateSchema(*stmt.info);
		result.plan =
		    make_uniq<LogicalCreate>(LogicalOperatorType::LOGICAL_CREATE_MACRO, std::move(stmt.info), &schema);
		break;
	}
	case CatalogType::MACRO_ENTRY: {
		auto &schema = BindCreateFunctionInfo(*stmt.info);
		auto logical_create =
		    make_uniq<LogicalCreate>(LogicalOperatorType::LOGICAL_CREATE_MACRO, std::move(stmt.info), &schema);
		result.plan = std::move(logical_create);
		break;
	}
	case CatalogType::INDEX_ENTRY: {
		auto &create_index_info = stmt.info->Cast<CreateIndexInfo>();

		// Plan the table scan.
		TableDescription table_description(create_index_info.catalog, create_index_info.schema,
		                                   create_index_info.table);
		auto table_ref = make_uniq<BaseTableRef>(table_description);
		auto bound_table = Bind(*table_ref);
		if (bound_table->type != TableReferenceType::BASE_TABLE) {
			throw BinderException("can only create an index on a base table");
		}

		auto &table_binding = bound_table->Cast<BoundBaseTableRef>();
		auto &table = table_binding.table;
		if (table.temporary) {
			stmt.info->temporary = true;
		}
		properties.RegisterDBModify(table.catalog, context);

		// create a plan over the bound table
		auto plan = CreatePlan(*bound_table);
		if (plan->type != LogicalOperatorType::LOGICAL_GET) {
			throw BinderException("Cannot create index on a view!");
		}

		result.plan = table.catalog.BindCreateIndex(*this, stmt, table, std::move(plan));
		break;
	}
	case CatalogType::TABLE_ENTRY: {
		auto bound_info = BindCreateTableInfo(std::move(stmt.info));
		auto root = std::move(bound_info->query);

		// create the logical operator
		auto &schema = bound_info->schema;
		auto create_table = make_uniq<LogicalCreateTable>(schema, std::move(bound_info));
		if (root) {
			// CREATE TABLE AS
			properties.return_type = StatementReturnType::CHANGED_ROWS;
			create_table->children.push_back(std::move(root));
		}
		result.plan = std::move(create_table);
		break;
	}
	case CatalogType::TYPE_ENTRY: {
		auto &schema = BindCreateSchema(*stmt.info);
		auto &create_type_info = stmt.info->Cast<CreateTypeInfo>();
		result.plan = make_uniq<LogicalCreate>(LogicalOperatorType::LOGICAL_CREATE_TYPE, std::move(stmt.info), &schema);

		auto &catalog = Catalog::GetCatalog(context, create_type_info.catalog);
		auto &dependencies = create_type_info.dependencies;
		auto dependency_callback = [&dependencies, &catalog](CatalogEntry &entry) {
			if (&catalog != &entry.ParentCatalog()) {
				// Don't register any cross-catalog dependencies
				return;
			}
			dependencies.AddDependency(entry);
		};
		if (create_type_info.query) {
			// CREATE TYPE mood AS ENUM (SELECT 'happy')
			auto query_obj = Bind(*create_type_info.query);
			auto query = std::move(query_obj.plan);
			create_type_info.query.reset();

			auto &sql_types = query_obj.types;
			if (sql_types.size() != 1) {
				// add cast expression?
				throw BinderException("The query must return a single column");
			}
			if (sql_types[0].id() != LogicalType::VARCHAR) {
				// push a projection casting to varchar
				vector<unique_ptr<Expression>> select_list;
				auto ref = make_uniq<BoundColumnRefExpression>(sql_types[0], query->GetColumnBindings()[0]);
				auto cast_expr = BoundCastExpression::AddCastToType(context, std::move(ref), LogicalType::VARCHAR);
				select_list.push_back(std::move(cast_expr));
				auto proj = make_uniq<LogicalProjection>(GenerateTableIndex(), std::move(select_list));
				proj->AddChild(std::move(query));
				query = std::move(proj);
			}

			result.plan->AddChild(std::move(query));
		} else if (create_type_info.type.id() == LogicalTypeId::USER) {
			SetCatalogLookupCallback(dependency_callback);
			// two cases:
			// 1: create a type with a non-existent type as source, Binder::BindLogicalType(...) will throw exception.
			// 2: create a type alias with a custom type.
			// eg. CREATE TYPE a AS INT; CREATE TYPE b AS a;
			// We set b to be an alias for the underlying type of a

			EntryLookupInfo type_lookup(CatalogType::TYPE_ENTRY, UserType::GetTypeName(create_type_info.type));
			auto type_entry_p = entry_retriever.GetEntry(schema.catalog.GetName(), schema.name, type_lookup);
			D_ASSERT(type_entry_p);
			auto &type_entry = type_entry_p->Cast<TypeCatalogEntry>();
			create_type_info.type = type_entry.user_type;
		} else {
			SetCatalogLookupCallback(dependency_callback);
			// This is done so that if the type contains a USER type,
			// we register this dependency
			auto preserved_type = create_type_info.type;
			BindLogicalType(create_type_info.type);
			create_type_info.type = preserved_type;
		}
		break;
	}
	case CatalogType::SECRET_ENTRY: {
		CatalogTransaction transaction = CatalogTransaction(Catalog::GetSystemCatalog(context), context);
		properties.return_type = StatementReturnType::QUERY_RESULT;

		auto &info = stmt.info->Cast<CreateSecretInfo>();

		// We need to execute all expressions in the CreateSecretInfo to construct a CreateSecretInput
		ConstantBinder default_binder(*this, context, "Secret Parameter");

		string provider_string, type_string;
		vector<string> scope_strings;

		if (info.provider) {
			auto bound_provider = default_binder.Bind(info.provider);
			if (bound_provider->HasParameter()) {
				throw InvalidInputException("Create Secret expressions can not have parameters!");
			}
			provider_string =
			    StringUtil::Lower(ExpressionExecutor::EvaluateScalar(context, *bound_provider, true).ToString());
		}
		if (info.type) {
			auto bound_type = default_binder.Bind(info.type);
			if (bound_type->HasParameter()) {
				throw InvalidInputException("Create Secret expressions can not have parameters!");
			}
			type_string = StringUtil::Lower(ExpressionExecutor::EvaluateScalar(context, *bound_type, true).ToString());
		}
		if (info.scope) {
			auto bound_scope = default_binder.Bind(info.scope);
			if (bound_scope->HasParameter()) {
				throw InvalidInputException("Create Secret expressions can not have parameters!");
			}
			// Execute all scope expressions
			Value scope = ExpressionExecutor::EvaluateScalar(context, *bound_scope, true);
			if (scope.type() == LogicalType::VARCHAR) {
				scope_strings.push_back(scope.ToString());
			} else if (scope.type() == LogicalType::LIST(LogicalType::VARCHAR)) {
				for (const auto &item : ListValue::GetChildren(scope)) {
					scope_strings.push_back(item.GetValue<string>());
				}
			} else if (scope.type().InternalType() == PhysicalType::STRUCT) {
				// struct expression with empty keys is also allowed for backwards compatibility to when the create
				// secret statement would be parsed differently: this allows CREATE SECRET (TYPE x, SCOPE ('bla',
				// 'bloe'))
				for (const auto &child : StructValue::GetChildren(scope)) {
					if (child.type() != LogicalType::VARCHAR) {
						throw InvalidInputException(
						    "Invalid input to scope parameter of create secret: only struct of VARCHARs is allowed");
					}
					scope_strings.push_back(child.GetValue<string>());
				}
			} else {
				throw InvalidInputException("Create Secret scope must be of type VARCHAR or LIST(VARCHAR)");
			}
		}

		// Execute all options expressions
		case_insensitive_map_t<Value> bound_options;
		for (auto &option : info.options) {
			auto bound_value = default_binder.Bind(option.second);
			if (bound_value->HasParameter()) {
				throw InvalidInputException("Create Secret expressions can not have parameters!");
			}
			bound_options.insert({option.first, ExpressionExecutor::EvaluateScalar(context, *bound_value, true)});
		}

		CreateSecretInput create_secret_input {type_string,   provider_string, info.storage_type, info.name,
		                                       scope_strings, bound_options,   info.on_conflict,  info.persist_type};

		return SecretManager::Get(context).BindCreateSecret(transaction, create_secret_input);
	}
	default:
		throw InternalException("Unrecognized type!");
	}
	properties.return_type = StatementReturnType::NOTHING;
	properties.allow_stream_result = false;
	return result;
}